

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O2

bool __thiscall lunasvg::SVGPoint::parse(SVGPoint *this,string_view input)

{
  bool bVar1;
  undefined8 local_30;
  string_view local_28;
  
  local_28._M_str = input._M_str;
  local_28._M_len = input._M_len;
  local_30 = 0;
  stripLeadingAndTrailingSpaces(&local_28);
  bVar1 = parseNumber<float>(&local_28,(float *)&local_30);
  if ((!bVar1) || (bVar1 = skipOptionalSpaces(&local_28), !bVar1)) {
    return false;
  }
  bVar1 = parseNumber<float>(&local_28,(float *)((long)&local_30 + 4));
  if (!bVar1) {
    return false;
  }
  if (local_28._M_len != 0) {
    return false;
  }
  *(undefined8 *)&(this->super_SVGProperty).field_0xc = local_30;
  return true;
}

Assistant:

bool SVGPoint::parse(std::string_view input)
{
    Point value;
    stripLeadingAndTrailingSpaces(input);
    if(!parseNumber(input, value.x)
        || !skipOptionalSpaces(input)
        || !parseNumber(input, value.y)
        || !input.empty()) {
        return false;
    }

    m_value = value;
    return true;
}